

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O2

_Bool new_player_spot(chunk_conflict *c,player *p)

{
  loc grid_00;
  loc grid_01;
  _Bool _Var1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  loc_conflict lVar5;
  loc_conflict bottom_right;
  int *state;
  wchar_t walls;
  int iVar6;
  bool bVar7;
  loc_conflict grid;
  
  if ((((p->opts).opt[0x2a] == true) &&
      (grid_00.x = (p->grid).x, grid_00.y = (p->grid).y, _Var1 = square_in_bounds_fully(c,grid_00),
      _Var1)) &&
     (grid_01.x = (p->grid).x, grid_01.y = (p->grid).y, _Var1 = square_isstairs(c,grid_01), _Var1))
  {
    grid = p->grid;
LAB_00155126:
    lVar5 = grid;
    if (((p->opts).opt[0x1e] != false) &&
       ((wVar3 = p->upkeep->create_stair, wVar3 == FEAT_MORE || (wVar3 == FEAT_LESS)))) {
      square_set_feat(c,(loc)grid,wVar3);
    }
    player_place((chunk_conflict2 *)c,p,(loc)lVar5);
    return true;
  }
  lVar5 = loc(1,1);
  bottom_right = loc(c->width + -2,c->height + -2);
  state = cave_find_init(lVar5,bottom_right);
  _Var1 = false;
  while( true ) {
    if (_Var1 != false) goto LAB_00155073;
    _Var2 = cave_find_get_grid(&grid,state);
    if (!_Var2) break;
    _Var1 = square_suits_stairs_well(c,(loc)grid);
  }
  state[4] = 0;
  while ((_Var1 == false && (_Var2 = cave_find_get_grid(&grid,state), _Var2))) {
    _Var1 = square_suits_stairs_ok(c,(loc)grid);
  }
LAB_00155073:
  if (_Var1 == false) {
    bVar7 = false;
    for (iVar6 = 6; (!bVar7 && (-1 < iVar6)); iVar6 = iVar6 + -1) {
      state[4] = 0;
      while ((!bVar7 && (_Var1 = cave_find_get_grid(&grid,state), lVar5 = grid, _Var1))) {
        _Var1 = square_isempty(c,(loc)grid);
        if ((_Var1) &&
           ((_Var1 = square_isvault(c,(loc)lVar5), !_Var1 &&
            (_Var1 = square_isno_stairs(c,(loc)lVar5), !_Var1)))) {
          wVar3 = square_num_walls_adjacent(c,(loc)lVar5);
          wVar4 = square_num_walls_diagonal(c,(loc)lVar5);
          bVar7 = wVar4 + wVar3 == iVar6;
        }
      }
    }
    mem_free(state);
    if (!bVar7) {
      msg("Failed to place player; please report.  Restarting generation.");
      dump_level_simple((char *)0x0,"Player Placement Failure",c);
      return false;
    }
  }
  else {
    mem_free(state);
  }
  goto LAB_00155126;
}

Assistant:

bool new_player_spot(struct chunk *c, struct player *p)
{
	struct loc grid;

	/* Try to find a good place to put the player */
	if (OPT(p, birth_levels_persist) &&
			square_in_bounds_fully(c, p->grid) &&
			square_isstairs(c, p->grid)) {
		grid = p->grid;
	} else if (!find_start(c, &grid)) {
		msg("Failed to place player; please report.  Restarting generation.");
		dump_level_simple(NULL, "Player Placement Failure", c);
		return false;
	}

	/* Create stairs the player came down if allowed and necessary */
	if (!OPT(p, birth_connect_stairs))
		;
	else if (p->upkeep->create_stair == FEAT_MORE)
		square_set_feat(c, grid, FEAT_MORE);
	else if (p->upkeep->create_stair == FEAT_LESS)
		square_set_feat(c, grid, FEAT_LESS);

	player_place(c, p, grid);
	return true;
}